

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.cc
# Opt level: O0

EStatus __thiscall
NFastBernoulli::TBaseSampler::Sample(TBaseSampler *this,TRng *rng,void *ptr,size_t size)

{
  ulong uVar1;
  pointer pIVar2;
  TExecutionPlan *pTVar3;
  size_t sVar4;
  result_type rVar5;
  result_type *local_58;
  uint64_t *it;
  uint64_t *end;
  uint64_t *begin;
  size_t noblocks;
  EStatus status;
  size_t size_local;
  void *ptr_local;
  TRng *rng_local;
  TBaseSampler *this_local;
  
  this_local._4_4_ = Validate(ptr,size);
  if (this_local._4_4_ == EOk) {
    pIVar2 = std::
             unique_ptr<NFastBernoulli::IExecutor,_std::default_delete<NFastBernoulli::IExecutor>_>
             ::operator->(&this->Executor_);
    pTVar3 = IExecutor::Plan(pIVar2);
    uVar1 = pTVar3->NoSrcBlocks_;
    sVar4 = GetBlockSize(this);
    for (local_58 = (result_type *)ptr;
        local_58 != (result_type *)((long)ptr + (size & 0xfffffffffffffff8));
        local_58 = local_58 + 1) {
      rVar5 = std::
              mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              ::operator()(rng);
      *local_58 = rVar5;
    }
    pIVar2 = std::
             unique_ptr<NFastBernoulli::IExecutor,_std::default_delete<NFastBernoulli::IExecutor>_>
             ::operator->(&this->Executor_);
    (*pIVar2->_vptr_IExecutor[2])(pIVar2,ptr,ptr,(size / uVar1) / sVar4);
    this_local._4_4_ = EOk;
  }
  return this_local._4_4_;
}

Assistant:

EStatus TBaseSampler::Sample(TRng &rng, void *ptr, size_t size) noexcept {
    if (auto status = Validate(ptr, size); status) {
        return status;
    }

    size_t noblocks = size / Executor_->Plan().NoSrcBlocks_ / GetBlockSize();
    uint64_t *begin = static_cast<uint64_t *>(ptr);
    uint64_t *end = begin + size / sizeof(uint64_t);

    for (auto it = begin; it != end; ++it) {
        *it = rng();
    }

    Executor_->Execute(ptr, ptr, noblocks);
    return EOk;
}